

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h265e_ps.c
# Opt level: O3

MPP_RET h265e_set_pps(H265eCtx *ctx,H265ePps *pps,H265eSps *sps)

{
  ulong uVar1;
  RK_U32 RVar2;
  RK_S32 RVar3;
  uint uVar4;
  MppEncCfgSet *pMVar5;
  RockchipSocType RVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  int iVar10;
  ulong uVar11;
  bool bVar12;
  undefined8 uVar13;
  
  pMVar5 = ctx->cfg;
  pps->m_bConstrainedIntraPred = (pMVar5->codec).field_1.h264.log2_max_frame_num;
  pps->m_PPSId = 0;
  pps->m_SPSId = 0;
  pps->m_useDQP = 1;
  RVar2 = (pMVar5->codec).field_1.h265.trans_cfg.diff_cu_qp_delta_depth;
  pps->m_maxCuDQPDepth = RVar2;
  pps->m_minCuDQPSize = sps->m_maxCUSize >> ((byte)RVar2 & 0x1f);
  pps->m_sps = sps;
  pps->m_bSliceChromaQpFlag = 0;
  RVar3 = (pMVar5->codec).field_1.h265.trans_cfg.cb_qp_offset;
  pps->m_chromaCbQpOffset = RVar3;
  pps->m_chromaCrQpOffset = RVar3;
  pps->m_bUseWeightPred = 0;
  pps->m_useWeightedBiPred = 0;
  pps->m_outputFlagPresentFlag = 0;
  pps->m_picInitQPMinus26 = (pMVar5->codec).field_1.h264.chroma_cb_qp_offset + -0x1a;
  pps->m_LFCrossSliceBoundaryFlag = (pMVar5->codec).field_1.h265.lpf_acs_sli_en;
  uVar13 = 0;
  bVar12 = (pMVar5->codec).field_1.h265.dblk_cfg.slice_deblocking_filter_disabled_flag == 0;
  pps->m_deblockingFilterControlPresentFlag = (uint)bVar12;
  bVar12 = !bVar12;
  if (!bVar12) {
    uVar13 = *(undefined8 *)((long)&(pMVar5->codec).field_1 + 0xf4);
  }
  pps->m_deblockingFilterOverrideEnabledFlag = 0;
  pps->m_picDisableDeblockingFilterFlag = (uint)bVar12;
  pps->m_deblockingFilterBetaOffsetDiv2 = (int)uVar13;
  pps->m_deblockingFilterTcOffsetDiv2 = (int)((ulong)uVar13 >> 0x20);
  pps->m_listsModificationPresentFlag = 1;
  pps->m_log2ParallelMergeLevelMinus2 = 0;
  pps->m_numRefIdxL0DefaultActive = 1;
  pps->m_numRefIdxL1DefaultActive = 1;
  uVar13 = *(undefined8 *)((long)&(pMVar5->codec).field_1 + 0xcc);
  pps->m_transquantBypassEnableFlag = (int)uVar13;
  pps->m_useTransformSkip = (int)((ulong)uVar13 >> 0x20);
  pps->m_cabacInitPresentFlag = (pMVar5->codec).field_1.h265.entropy_cfg.cabac_init_flag;
  pps->m_encCABACTableIdx = 2;
  pps->m_sliceHeaderExtensionPresentFlag = 0;
  pps->m_numExtraSliceHeaderBits = 0;
  pps->m_entropyCodingSyncEnabledFlag = 0;
  pps->m_signHideFlag = 0;
  pps->m_tiles_enabled_flag = 0;
  pps->m_bTileUniformSpacing = 0;
  pps->m_nNumTileRowsMinus1 = 0;
  pps->m_nNumTileColumnsMinus1 = 0;
  pps->m_loopFilterAcrossTilesEnabledFlag =
       (uint)((pMVar5->codec).field_1.h265.lpf_acs_tile_disable == 0);
  RVar6 = mpp_get_soc_type();
  uVar4 = sps->m_picWidthInLumaSamples;
  uVar8 = sps->m_maxCUSize;
  uVar7 = ((uVar4 + uVar8) - 1) / uVar8;
  uVar8 = ((uVar8 + sps->m_picHeightInLumaSamples) - 1) / uVar8;
  if (RVar6 == ROCKCHIP_SOC_RK3566) {
LAB_001d1294:
    uVar9 = (ulong)(uVar4 - 1) / 0x780;
LAB_001d12a8:
    pps->m_nNumTileColumnsMinus1 = (RK_S32)uVar9;
  }
  else {
    if (RVar6 == ROCKCHIP_SOC_RK3588) {
      uVar9 = 3;
      if ((0x2000 < uVar4) || (uVar9 = 1, 0x1000 < uVar4)) {
        pps->m_nNumTileColumnsMinus1 = (RK_S32)uVar9;
        goto LAB_001d12df;
      }
      uVar9 = (ulong)((pMVar5->codec).field_1.h265.auto_tile != 0);
      goto LAB_001d12a8;
    }
    if (RVar6 == ROCKCHIP_SOC_RK3568) goto LAB_001d1294;
    uVar9 = (ulong)(uint)pps->m_nNumTileColumnsMinus1;
  }
  if ((int)uVar9 == 0) {
    return MPP_OK;
  }
LAB_001d12df:
  pps->m_tiles_enabled_flag = 1;
  pps->m_bTileUniformSpacing = 1;
  pps->m_loopFilterAcrossTilesEnabledFlag =
       (uint)((pMVar5->codec).field_1.h265.lpf_acs_tile_disable == 0);
  iVar10 = (int)uVar9 + 1;
  if ((int)uVar9 < 1) {
    uVar9 = 0;
  }
  else {
    uVar11 = 0;
    do {
      uVar1 = uVar11 + 1;
      pps->m_nTileColumnWidthArray[uVar11] =
           (int)(uVar7 * (int)uVar1) / iVar10 - (int)((int)uVar11 * uVar7) / iVar10;
      pps->m_nTileRowHeightArray[uVar11] = uVar8;
      uVar11 = uVar1;
    } while (uVar9 != uVar1);
  }
  pps->m_nTileColumnWidthArray[uVar9] = uVar7 - (int)((int)uVar9 * uVar7) / iVar10;
  pps->m_nTileRowHeightArray[uVar9] = uVar8;
  return MPP_OK;
}

Assistant:

MPP_RET h265e_set_pps(H265eCtx  *ctx, H265ePps *pps, H265eSps *sps)
{
    MppEncH265Cfg *codec = &ctx->cfg->codec.h265;

    pps->m_bConstrainedIntraPred = codec->const_intra_pred;
    pps->m_PPSId = 0;
    pps->m_SPSId = 0;
    pps->m_picInitQPMinus26 = 0;
    pps->m_useDQP = 1;
    pps->m_maxCuDQPDepth = codec->trans_cfg.diff_cu_qp_delta_depth;
    pps->m_minCuDQPSize = (sps->m_maxCUSize >> pps->m_maxCuDQPDepth);

    pps->m_sps = sps;
    pps->m_bSliceChromaQpFlag = 0;
    pps->m_chromaCbQpOffset = codec->trans_cfg.cb_qp_offset;
    /* rkvenc hw only support one color qp offset. Set all offset to cb offset*/
    pps->m_chromaCrQpOffset = codec->trans_cfg.cb_qp_offset;

    pps->m_entropyCodingSyncEnabledFlag = 0;
    pps->m_bUseWeightPred = 0;
    pps->m_useWeightedBiPred = 0;
    pps->m_outputFlagPresentFlag = 0;
    pps->m_signHideFlag = 0;
    pps->m_picInitQPMinus26 = codec->intra_qp - 26;
    pps->m_LFCrossSliceBoundaryFlag = codec->lpf_acs_sli_en;
    pps->m_deblockingFilterControlPresentFlag = !codec->dblk_cfg.slice_deblocking_filter_disabled_flag;
    if (pps->m_deblockingFilterControlPresentFlag) {
        pps->m_deblockingFilterOverrideEnabledFlag = 0;
        pps->m_picDisableDeblockingFilterFlag = 0;
        if (!pps->m_picDisableDeblockingFilterFlag) {
            pps->m_deblockingFilterBetaOffsetDiv2 = codec->dblk_cfg.slice_beta_offset_div2;
            pps->m_deblockingFilterTcOffsetDiv2 = codec->dblk_cfg.slice_tc_offset_div2;
        }
    } else {
        pps->m_deblockingFilterOverrideEnabledFlag = 0;
        pps->m_picDisableDeblockingFilterFlag = 1;
        pps->m_deblockingFilterBetaOffsetDiv2 = 0;
        pps->m_deblockingFilterTcOffsetDiv2 = 0;
    }

    pps->m_listsModificationPresentFlag = 1;
    pps->m_log2ParallelMergeLevelMinus2 = 0;
    pps->m_numRefIdxL0DefaultActive = 1;
    pps->m_numRefIdxL1DefaultActive = 1;
    pps->m_transquantBypassEnableFlag = codec->trans_cfg.transquant_bypass_enabled_flag;
    pps->m_useTransformSkip = codec->trans_cfg.transform_skip_enabled_flag;

    pps->m_entropyCodingSyncEnabledFlag = 0;
    pps->m_signHideFlag = 0;
    pps->m_cabacInitPresentFlag = codec->entropy_cfg.cabac_init_flag;
    pps->m_encCABACTableIdx = I_SLICE;
    pps->m_sliceHeaderExtensionPresentFlag = 0;
    pps->m_numExtraSliceHeaderBits = 0;
    pps->m_tiles_enabled_flag = 0;
    pps->m_bTileUniformSpacing = 0;
    pps->m_nNumTileRowsMinus1 = 0;
    pps->m_nNumTileColumnsMinus1 = 0;
    pps->m_loopFilterAcrossTilesEnabledFlag = !codec->lpf_acs_tile_disable;
    {
        RockchipSocType soc_type = mpp_get_soc_type();
        RK_S32 index;
        RK_S32 mb_w = (sps->m_picWidthInLumaSamples + sps->m_maxCUSize - 1) / sps->m_maxCUSize;
        RK_S32 mb_h = (sps->m_picHeightInLumaSamples + sps->m_maxCUSize - 1) / sps->m_maxCUSize;
        RK_S32 tile_width;

        /* check tile support on rk3566 and rk3568 */
        if (soc_type == ROCKCHIP_SOC_RK3566 || soc_type == ROCKCHIP_SOC_RK3568) {
            pps->m_nNumTileColumnsMinus1 = (sps->m_picWidthInLumaSamples - 1) / 1920 ;
        } else if (soc_type == ROCKCHIP_SOC_RK3588) {
            if (sps->m_picWidthInLumaSamples > 8192) {
                /* 4 tile for over 8k encoding */
                pps->m_nNumTileColumnsMinus1 = 3;
            } else if (sps->m_picWidthInLumaSamples > 4096) {
                /* 2 tile for 4k ~ 8k encoding */
                pps->m_nNumTileColumnsMinus1 = 1;
            } else {
                /* 1 tile for less 4k encoding and use 2 tile on auto tile enabled */
                pps->m_nNumTileColumnsMinus1 = codec->auto_tile ? 1 : 0;
            }
        }
        if (pps->m_nNumTileColumnsMinus1) {
            pps->m_tiles_enabled_flag = 1;
            pps->m_bTileUniformSpacing = 1;
            pps->m_loopFilterAcrossTilesEnabledFlag = !codec->lpf_acs_tile_disable;

            /* calc width per tile */
            for (index = 0; index < pps->m_nNumTileColumnsMinus1; index++) {
                tile_width = (index + 1) * mb_w / (pps->m_nNumTileColumnsMinus1 + 1) -
                             index * mb_w / (pps->m_nNumTileColumnsMinus1 + 1);
                pps->m_nTileColumnWidthArray[index] = tile_width;
                pps->m_nTileRowHeightArray[index] = mb_h;
            }
            tile_width = mb_w - index * mb_w / (pps->m_nNumTileColumnsMinus1 + 1);
            pps->m_nTileColumnWidthArray[index] = tile_width;
            pps->m_nTileRowHeightArray[index] = mb_h;
        }
    }

    return 0;
}